

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O0

bool __thiscall WorkerFlow::work(WorkerFlow *this)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  bool bVar5;
  void *pvStack_38;
  int timeout;
  zmq_pollitem_t items [2];
  WorkerFlow *this_local;
  
  pvStack_38 = this->m_stream_socket;
  items[0].socket._0_4_ = 0;
  items[0].socket._4_2_ = 1;
  items[0].socket._6_2_ = 0;
  items[0]._8_8_ = this->m_notif_socket;
  items[1].socket._0_4_ = 0;
  items[1].socket._4_2_ = 1;
  items[1].socket._6_2_ = 0;
  items[1]._8_8_ = this;
  while( true ) {
    iVar1 = zmq_poll(&stack0xffffffffffffffc8,2,0xffffffffffffffff);
    bVar5 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar5 = *piVar2 == 4;
    }
    if (!bVar5) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"zmq_poll: retrying");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if ((items[0].socket._6_2_ & 1) == 0) {
    if ((items[1].socket._6_2_ & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Panic! > ");
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = recv_notif(this);
    }
  }
  else {
    this_local._7_1_ = recv_stream(this);
  }
  return this_local._7_1_;
}

Assistant:

bool WorkerFlow::work()
{
    // zmq_pollitem_t.socket  = zmq obscure socket
    // zmq_pollitem_t.fd      = socket fd
    // zmq_pollitem_t.events  = what to poll
    // zmq_pollitem_t.revents = what was catched
    zmq_pollitem_t items[] = {
        { m_stream_socket, 0, ZMQ_POLLIN, 0 },
        { m_notif_socket,  0, ZMQ_POLLIN, 0 }
    };
    // Wait until there is data to read in either channel
    int timeout = -1; // return inmediatly
    while (zmq_poll(items, 2, timeout) == -1 && errno == EINTR) {
        std::cout << "zmq_poll: retrying" << std::endl;
    }

    // Multiplex channels
    // If stream socket has data to read
    if (items[0].revents & ZMQ_POLLIN) {
        return recv_stream();
    }
    // If notification channel has data to read
    if (items[1].revents & ZMQ_POLLIN) {
        return recv_notif();
    }
    
    // zmq_poll failed with errno != EINTR
    std::cout << "Panic! > " << strerror(errno) << std::endl;
    return false;
}